

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PipelineClassifier::MergeFrom
          (PipelineClassifier *this,PipelineClassifier *from)

{
  ulong uVar1;
  LogMessage *other;
  Pipeline *pPVar2;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/Model.pb.cc"
               ,0x222);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((from != (PipelineClassifier *)_PipelineClassifier_default_instance_) &&
     (from->pipeline_ != (Pipeline *)0x0)) {
    if (this->pipeline_ == (Pipeline *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pPVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Pipeline>(arena);
      this->pipeline_ = pPVar2;
    }
    from_00 = (undefined1 *)from->pipeline_;
    if ((Pipeline *)from_00 == (Pipeline *)0x0) {
      from_00 = _Pipeline_default_instance_;
    }
    Pipeline::MergeFrom(this->pipeline_,(Pipeline *)from_00);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void PipelineClassifier::MergeFrom(const PipelineClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PipelineClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_pipeline()) {
    _internal_mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from._internal_pipeline());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}